

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall
HighsMipSolverData::finishAnalyticCenterComputation(HighsMipSolverData *this,TaskGroup *taskGroup)

{
  double dVar1;
  long lVar2;
  Reason reason;
  Reason reason_00;
  int iVar3;
  bool bVar4;
  HighsVarType HVar5;
  HighsInt HVar6;
  pointer pHVar7;
  reference pvVar8;
  double *pdVar9;
  const_reference pvVar10;
  TaskGroup *in_RSI;
  long *in_RDI;
  double tolerance;
  double boundRange;
  HighsInt i;
  HighsInt nintfixed;
  HighsInt nfixed;
  HighsDomain *in_stack_000001e8;
  HighsDomain *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  HighsMipAnalysis *in_stack_ffffffffffffff58;
  value_type in_stack_ffffffffffffff60;
  HighsDomain *in_stack_ffffffffffffff68;
  HighsInt in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  double local_38;
  double local_30;
  double local_28;
  int local_1c;
  uint local_18;
  uint local_14;
  TaskGroup *local_10;
  
  local_10 = in_RSI;
  if ((*(byte *)(*in_RDI + 0x130) & 1) != 0) {
    lVar2 = *(long *)(*in_RDI + 8);
    HighsMipAnalysis::mipTimerRead(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    highsLogUser((HighsLogOptions *)(lVar2 + 0x380),kInfo,
                 "MIP-Timing: %11.2g - starting  analytic centre synch\n");
    fflush(_stdout);
  }
  ::highs::parallel::TaskGroup::sync(local_10);
  if ((*(byte *)(*in_RDI + 0x130) & 1) != 0) {
    lVar2 = *(long *)(*in_RDI + 8);
    HighsMipAnalysis::mipTimerRead(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    highsLogUser((HighsLogOptions *)(lVar2 + 0x380),kInfo,
                 "MIP-Timing: %11.2g - completed analytic centre synch\n");
    fflush(_stdout);
  }
  *(undefined1 *)((long)in_RDI + 0x6412) = 1;
  if (*(int *)((long)in_RDI + 0x6414) == 7) {
    local_14 = 0;
    local_18 = 0;
    for (local_1c = 0; iVar3 = local_1c, HVar6 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI),
        iVar3 != HVar6; local_1c = local_1c + 1) {
      pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x623182);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(pHVar7->domain).col_upper_,(long)local_1c);
      dVar1 = *pvVar8;
      pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x6231c1);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(pHVar7->domain).col_lower_,(long)local_1c);
      local_28 = dVar1 - *pvVar8;
      if ((local_28 != 0.0) || (NAN(local_28))) {
        pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x62321f);
        dVar1 = pHVar7->feastol;
        local_38 = 1.0;
        pdVar9 = std::min<double>(&local_28,&local_38);
        local_30 = dVar1 * *pdVar9;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xcc8),
                            (long)local_1c);
        dVar1 = *pvVar8;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             (*(long *)(*in_RDI + 0x10) + 0x20),(long)local_1c);
        if (*pvVar10 + local_30 < dVar1) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xcc8),
                              (long)local_1c);
          in_stack_ffffffffffffff60 = *pvVar8;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               (*(long *)(*in_RDI + 0x10) + 0x38),(long)local_1c);
          if (*pvVar10 - local_30 <= in_stack_ffffffffffffff60) {
            pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x623424);
            in_stack_ffffffffffffff48 = &pHVar7->domain;
            in_stack_ffffffffffffff54 = local_1c;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 (*(long *)(*in_RDI + 0x10) + 0x38),(long)local_1c);
            in_stack_ffffffffffffff58 = (HighsMipAnalysis *)*pvVar10;
            HighsDomain::Reason::unspecified();
            reason_00.index = in_stack_ffffffffffffff74;
            reason_00.type = in_stack_ffffffffffffff70;
            HighsDomain::changeBound
                      (in_stack_ffffffffffffff68,
                       (HighsBoundType)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                       SUB84(in_stack_ffffffffffffff60,0),(double)in_stack_ffffffffffffff58,
                       reason_00);
            pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x62349c);
            bVar4 = HighsDomain::infeasible(&pHVar7->domain);
            if (bVar4) {
              return;
            }
            local_14 = local_14 + 1;
            HVar5 = HighsMipSolver::variableType
                              ((HighsMipSolver *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               (HighsInt)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            if (HVar5 == kInteger) {
              local_18 = local_18 + 1;
            }
          }
        }
        else {
          pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x6232da);
          in_stack_ffffffffffffff68 = &pHVar7->domain;
          in_stack_ffffffffffffff74 = local_1c;
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(*(long *)(*in_RDI + 0x10) + 0x20),
                     (long)local_1c);
          HighsDomain::Reason::unspecified();
          reason.index = in_stack_ffffffffffffff74;
          reason.type = in_stack_ffffffffffffff70;
          HighsDomain::changeBound
                    (in_stack_ffffffffffffff68,
                     (HighsBoundType)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                     SUB84(in_stack_ffffffffffffff60,0),(double)in_stack_ffffffffffffff58,reason);
          pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x623357);
          bVar4 = HighsDomain::infeasible(&pHVar7->domain);
          if (bVar4) {
            return;
          }
          local_14 = local_14 + 1;
          HVar5 = HighsMipSolver::variableType
                            ((HighsMipSolver *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             (HighsInt)((ulong)in_stack_ffffffffffffff48 >> 0x20));
          if (HVar5 == kInteger) {
            local_18 = local_18 + 1;
          }
        }
      }
    }
    if (0 < (int)local_14) {
      highsLogDev((HighsLogOptions *)(*(long *)(*in_RDI + 8) + 0x380),kInfo,
                  "Fixing %d columns (%d integers) sitting at bound at analytic center\n",
                  (ulong)local_14,(ulong)local_18);
    }
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x62355f)
    ;
    HighsDomain::propagate(in_stack_000001e8);
    pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x623582);
    HighsDomain::infeasible(&pHVar7->domain);
  }
  return;
}

Assistant:

void HighsMipSolverData::finishAnalyticCenterComputation(
    const highs::parallel::TaskGroup& taskGroup) {
  if (mipsolver.analysis_.analyse_mip_time) {
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "MIP-Timing: %11.2g - starting  analytic centre synch\n",
                 mipsolver.analysis_.mipTimerRead());
    fflush(stdout);
  }
  taskGroup.sync();
  if (mipsolver.analysis_.analyse_mip_time) {
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "MIP-Timing: %11.2g - completed analytic centre synch\n",
                 mipsolver.analysis_.mipTimerRead());
    fflush(stdout);
  }
  analyticCenterComputed = true;
  if (analyticCenterStatus == HighsModelStatus::kOptimal) {
    HighsInt nfixed = 0;
    HighsInt nintfixed = 0;
    for (HighsInt i = 0; i != mipsolver.numCol(); ++i) {
      double boundRange = mipsolver.mipdata_->domain.col_upper_[i] -
                          mipsolver.mipdata_->domain.col_lower_[i];
      if (boundRange == 0.0) continue;

      double tolerance =
          mipsolver.mipdata_->feastol * std::min(boundRange, 1.0);

      if (analyticCenter[i] <= mipsolver.model_->col_lower_[i] + tolerance) {
        mipsolver.mipdata_->domain.changeBound(
            HighsBoundType::kUpper, i, mipsolver.model_->col_lower_[i],
            HighsDomain::Reason::unspecified());
        if (mipsolver.mipdata_->domain.infeasible()) return;
        ++nfixed;
        if (mipsolver.variableType(i) == HighsVarType::kInteger) ++nintfixed;
      } else if (analyticCenter[i] >=
                 mipsolver.model_->col_upper_[i] - tolerance) {
        mipsolver.mipdata_->domain.changeBound(
            HighsBoundType::kLower, i, mipsolver.model_->col_upper_[i],
            HighsDomain::Reason::unspecified());
        if (mipsolver.mipdata_->domain.infeasible()) return;
        ++nfixed;
        if (mipsolver.variableType(i) == HighsVarType::kInteger) ++nintfixed;
      }
    }
    if (nfixed > 0)
      highsLogDev(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                  "Fixing %d columns (%d integers) sitting at bound at "
                  "analytic center\n",
                  int(nfixed), int(nintfixed));
    mipsolver.mipdata_->domain.propagate();
    if (mipsolver.mipdata_->domain.infeasible()) return;
  }
}